

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManFlipUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Obj_t *pObj;
  long lVar12;
  long lVar13;
  
  p_00 = Gia_ManStart(p->nObjs << 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar8->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00594f82;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_00594f63;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_00594f63;
      pGVar3[iVar5].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCis;
    } while (lVar12 < pVVar8->nSize);
  }
  if (p->nObjs < 1) {
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    lVar13 = 8;
    uVar11 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)((long)pGVar3 + lVar13 + -8);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar1 = *(uint *)((long)pGVar3 +
                         lVar13 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar2 = *(uint *)((long)pGVar3 +
                             lVar13 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_00594fa1;
        iVar5 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar10 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar10 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar13) = iVar5;
        if (((int)uVar11 < 0) || (vMap->nSize <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar10 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        iVar5 = vMap->pArray[uVar10];
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if (iVar5 == 0) {
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_00594f63;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_00594f63;
        }
        else {
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) {
LAB_00594f63:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_00594f63;
          iVar5 = Gia_ManHashXor(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556,
                                 *(int *)(&pGVar3->field_0x0 + lVar13));
          *(int *)(&pGVar3->field_0x0 + lVar13) = iVar5;
        }
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  if (uVar11 != vMap->nSize) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x200,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar8->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00594f82:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_00594fa1:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar11;
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar5 = p->vCis->nSize;
  if (pGVar9->vCis->nSize - pGVar9->nRegs != iVar5 + p->nObjs + ~(p->vCos->nSize + iVar5)) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x205,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManFlipUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p) );
    return pNew;
}